

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O0

void beltMACStepG_internal(void *state)

{
  u32 *in_RDI;
  belt_mac_st *st;
  octet in_stack_ffffffffffffffef;
  
  if (*(long *)(in_RDI + 0x18) == 0x10) {
    *(ulong *)(in_RDI + 0x10) = *(ulong *)(in_RDI + 8) ^ *(ulong *)(in_RDI + 0x14);
    *(ulong *)(in_RDI + 0x12) = *(ulong *)(in_RDI + 10) ^ *(ulong *)(in_RDI + 0x16);
    in_RDI[0x10] = in_RDI[0xd] ^ in_RDI[0x10];
    in_RDI[0x11] = in_RDI[0xe] ^ in_RDI[0x11];
    in_RDI[0x12] = in_RDI[0xf] ^ in_RDI[0x12];
    in_RDI[0x13] = in_RDI[0xc] ^ in_RDI[0xd] ^ in_RDI[0x13];
  }
  else {
    *(undefined1 *)((long)in_RDI + *(long *)(in_RDI + 0x18) + 0x50) = 0x80;
    memSet(in_RDI,in_stack_ffffffffffffffef,0x1444e4);
    *(ulong *)(in_RDI + 0x10) = *(ulong *)(in_RDI + 8) ^ *(ulong *)(in_RDI + 0x14);
    *(ulong *)(in_RDI + 0x12) = *(ulong *)(in_RDI + 10) ^ *(ulong *)(in_RDI + 0x16);
    in_RDI[0x10] = in_RDI[0xc] ^ in_RDI[0xf] ^ in_RDI[0x10];
    in_RDI[0x11] = in_RDI[0xc] ^ in_RDI[0x11];
    in_RDI[0x12] = in_RDI[0xd] ^ in_RDI[0x12];
    in_RDI[0x13] = in_RDI[0xe] ^ in_RDI[0x13];
  }
  beltBlockEncr2(in_RDI + 0x10,in_RDI);
  return;
}

Assistant:

static void beltMACStepG_internal(void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsValid(state, beltMAC_keep()));
	// полный блок?
	if (st->filled == 16)
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor(st->mac, st->s, st->block);
		st->mac[0] ^= st->r[1];
		st->mac[1] ^= st->r[2];
		st->mac[2] ^= st->r[3];
		st->mac[3] ^= st->r[0] ^ st->r[1];
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
	}
	// неполный (в т.ч. пустой) блок?
	else
	{
		st->block[st->filled] = 0x80;
		memSetZero(st->block + st->filled + 1, 16 - st->filled - 1);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor(st->mac, st->s, st->block);
		st->mac[0] ^= st->r[0] ^ st->r[3];
		st->mac[1] ^= st->r[0];
		st->mac[2] ^= st->r[1];
		st->mac[3] ^= st->r[2];
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
	}
	beltBlockEncr2(st->mac, st->key);
}